

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuf.c
# Opt level: O2

ringbuf * ringbuf_new(uint length)

{
  int iVar1;
  ringbuf *__ptr;
  
  if (((length & length - 1) == 0) &&
     (__ptr = (ringbuf *)Zalloc((ulong)length * 8 + 0x118), __ptr != (ringbuf *)0x0)) {
    iVar1 = os_semaphore_init(&(__ptr->field_2).nfree,length);
    if (iVar1 == 0) {
      iVar1 = os_semaphore_init(&(__ptr->field_3).nused,0);
      if (iVar1 == 0) {
        (__ptr->field_0).read_pos = 0;
        (__ptr->field_1).write_pos = 0;
        __ptr->len = length;
        __ptr->len_mask = (ulong)(length - 1);
        __ptr->running = 1;
        return __ptr;
      }
      util_semaphore_destroy(&(__ptr->field_2).nfree);
    }
    free(__ptr);
  }
  return (ringbuf *)0x0;
}

Assistant:

struct ringbuf *
ringbuf_new(unsigned length)
{
	LOG(4, NULL);

	/* length must be a power of two due to masking */
	if (util_popcount(length) > 1)
		return NULL;

	struct ringbuf *rbuf =
		Zalloc(sizeof(*rbuf) + (length * sizeof(void *)));
	if (rbuf == NULL)
		return NULL;

	if (os_semaphore_init(&rbuf->nfree, length)) {
		Free(rbuf);
		return NULL;
	}

	if (os_semaphore_init(&rbuf->nused, 0)) {
		util_semaphore_destroy(&rbuf->nfree);
		Free(rbuf);
		return NULL;
	}

	rbuf->read_pos = 0;
	rbuf->write_pos = 0;

	rbuf->len = length;
	rbuf->len_mask = length - 1;
	rbuf->running = 1;

	return rbuf;
}